

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  stbi_uc *psVar16;
  byte bVar17;
  stbi_uc sVar18;
  uint uVar19;
  undefined4 in_register_0000000c;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint n;
  byte bVar26;
  uint uVar27;
  size_t __size;
  size_t __size_00;
  char *local_70;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar7 = stbi__gif_header(s,g,comp,0);
    if (iVar7 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar7 = g->w;
    iVar8 = g->h;
    iVar9 = stbi__mad3sizes_valid(4,iVar7,iVar8,0);
    if (iVar9 == 0) {
      stbi__g_failure_reason = "too large";
      return (stbi_uc *)0x0;
    }
    iVar8 = iVar8 * iVar7;
    __size = (size_t)(iVar8 * 4);
    psVar13 = (stbi_uc *)malloc(__size);
    g->out = psVar13;
    psVar14 = (stbi_uc *)malloc(__size);
    g->background = psVar14;
    __size_00 = (size_t)iVar8;
    psVar15 = (stbi_uc *)malloc(__size_00);
    g->history = psVar15;
    local_70 = "outofmem";
    if (psVar13 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = local_70;
      return (stbi_uc *)0x0;
    }
    if (psVar15 == (stbi_uc *)0x0 || psVar14 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = local_70;
      return (stbi_uc *)0x0;
    }
    memset(psVar13,0,__size);
    memset(psVar14,0,__size);
    memset(psVar15,0,__size_00);
  }
  else {
    uVar25 = (uint)g->eflags >> 2 & 7;
    uVar6 = g->h * g->w;
    uVar19 = 2;
    if (uVar25 != 3) {
      uVar19 = uVar25;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar19 = uVar25;
    }
    if (uVar19 == 3) {
      if (0 < (int)uVar6) {
        uVar20 = 0;
        do {
          if (g->history[uVar20] != '\0') {
            *(undefined4 *)(g->out + uVar20 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar20 * 4);
          }
          uVar20 = uVar20 + 1;
        } while (uVar6 != uVar20);
      }
    }
    else if ((uVar19 == 2) && (0 < (int)uVar6)) {
      uVar20 = 0;
      do {
        if (g->history[uVar20] != '\0') {
          *(undefined4 *)(g->out + uVar20 * 4) = *(undefined4 *)(g->background + uVar20 * 4);
        }
        uVar20 = uVar20 + 1;
      } while (uVar6 != uVar20);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar15 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar15,0,__size_00);
  psVar15 = s->buffer_start;
  psVar13 = s->buffer_start + 1;
  local_70 = "unknown code";
LAB_0031bdc8:
  pbVar2 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  if (pbVar2 < psVar14) {
    s->img_buffer = pbVar2 + 1;
    bVar5 = *pbVar2;
    psVar16 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks == 0) {
      stbi__g_failure_reason = local_70;
      return (stbi_uc *)0x0;
    }
    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar7 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
      psVar14 = psVar13;
    }
    else {
      bVar5 = *psVar15;
      psVar14 = psVar15 + iVar7;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar13;
    psVar16 = psVar13;
  }
  if (bVar5 == 0x21) {
    if (psVar16 < psVar14) {
      s->img_buffer = psVar16 + 1;
      bVar5 = *psVar16;
      psVar16 = psVar16 + 1;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_0031c05f;
      iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
      if (iVar7 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar5 = 0;
        psVar14 = psVar13;
      }
      else {
        bVar5 = *psVar15;
        psVar14 = psVar15 + iVar7;
      }
      s->img_buffer_end = psVar14;
      s->img_buffer = psVar13;
      psVar16 = psVar13;
    }
    if (bVar5 != 0xf9) goto LAB_0031c05f;
    if (psVar16 < psVar14) {
      s->img_buffer = psVar16 + 1;
      bVar5 = *psVar16;
      psVar16 = psVar16 + 1;
LAB_0031bef6:
      if (bVar5 == 4) {
        if (psVar16 < psVar14) {
          s->img_buffer = psVar16 + 1;
          bVar5 = *psVar16;
        }
        else if (s->read_from_callbacks == 0) {
          bVar5 = 0;
        }
        else {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar5 = 0;
            psVar14 = psVar13;
          }
          else {
            bVar5 = *psVar15;
            psVar14 = psVar15 + iVar7;
          }
          s->img_buffer_end = psVar14;
          s->img_buffer = psVar13;
        }
        g->eflags = (uint)bVar5;
        iVar7 = stbi__get16le(s);
        g->delay = iVar7 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          pbVar2 = s->img_buffer;
          if (pbVar2 < s->img_buffer_end) {
            s->img_buffer = pbVar2 + 1;
            bVar5 = *pbVar2;
          }
          else if (s->read_from_callbacks == 0) {
            bVar5 = 0;
          }
          else {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar5 = 0;
              psVar14 = psVar13;
            }
            else {
              bVar5 = *psVar15;
              psVar14 = psVar15 + iVar7;
            }
            s->img_buffer_end = psVar14;
            s->img_buffer = psVar13;
          }
          g->transparent = (uint)bVar5;
          g->pal[bVar5][3] = '\0';
          goto LAB_0031c05f;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar14 = s->img_buffer;
LAB_0031c00f:
          s->img_buffer = psVar14 + 1;
        }
        else {
          psVar14 = s->img_buffer;
          iVar7 = (int)s->img_buffer_end - (int)psVar14;
          if (0 < iVar7) goto LAB_0031c00f;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar7);
        }
        g->transparent = -1;
LAB_0031c05f:
        do {
          pbVar2 = s->img_buffer;
          if (pbVar2 < s->img_buffer_end) {
            s->img_buffer = pbVar2 + 1;
            bVar5 = *pbVar2;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0031bdc8;
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar5 = 0;
              psVar14 = psVar13;
            }
            else {
              bVar5 = *psVar15;
              psVar14 = psVar15 + iVar7;
            }
            s->img_buffer_end = psVar14;
            s->img_buffer = psVar13;
          }
          if (bVar5 == 0) goto LAB_0031bdc8;
          stbi__skip(s,(uint)bVar5);
        } while( true );
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar5 = 0;
          psVar14 = psVar13;
        }
        else {
          bVar5 = *psVar15;
          psVar14 = psVar15 + iVar7;
        }
        s->img_buffer_end = psVar14;
        s->img_buffer = psVar13;
        psVar16 = psVar13;
        goto LAB_0031bef6;
      }
      bVar5 = 0;
    }
    stbi__skip(s,(uint)bVar5);
    goto LAB_0031bdc8;
  }
  if (bVar5 == 0x3b) {
    return (stbi_uc *)s;
  }
  if (bVar5 != 0x2c) {
    stbi__g_failure_reason = local_70;
    return (stbi_uc *)0x0;
  }
  iVar7 = stbi__get16le(s);
  iVar8 = stbi__get16le(s);
  iVar9 = stbi__get16le(s);
  iVar10 = stbi__get16le(s);
  local_70 = "bad Image Descriptor";
  if (g->w < iVar9 + iVar7) {
    stbi__g_failure_reason = local_70;
    return (stbi_uc *)0x0;
  }
  if (g->h < iVar10 + iVar8) {
    stbi__g_failure_reason = local_70;
    return (stbi_uc *)0x0;
  }
  iVar22 = g->w * 4;
  g->line_size = iVar22;
  g->start_x = iVar7 << 2;
  g->start_y = iVar8 * iVar22;
  g->max_x = (iVar9 + iVar7) * 4;
  iVar10 = (iVar10 + iVar8) * iVar22;
  g->max_y = iVar10;
  g->cur_x = iVar7 << 2;
  if (iVar9 != 0) {
    iVar10 = iVar8 * iVar22;
  }
  g->cur_y = iVar10;
  psVar14 = s->img_buffer;
  psVar16 = s->img_buffer_end;
  if (psVar14 < psVar16) {
    s->img_buffer = psVar14 + 1;
    bVar5 = *psVar14;
    psVar14 = psVar14 + 1;
LAB_0031c239:
    uVar19 = (uint)bVar5;
    g->lflags = uVar19;
    iVar7 = iVar22 * 8;
    if ((bVar5 & 0x40) == 0) {
      iVar7 = iVar22;
    }
    iVar22 = iVar7;
    uVar6 = (int)(uVar19 << 0x19) >> 0x1f & 3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
      if (iVar7 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar5 = 0;
        psVar16 = psVar13;
      }
      else {
        bVar5 = *psVar15;
        psVar16 = psVar15 + iVar7;
      }
      s->img_buffer_end = psVar16;
      s->img_buffer = psVar13;
      iVar22 = g->line_size;
      psVar14 = psVar13;
      goto LAB_0031c239;
    }
    g->lflags = 0;
    uVar6 = 0;
    uVar19 = 0;
  }
  g->step = iVar22;
  g->parse = uVar6;
  if (uVar19 < 0x80) {
    if ((g->flags & 0x80) == 0) {
      stbi__g_failure_reason = "missing color table";
      return (stbi_uc *)0x0;
    }
    g->color_table = g->pal[0];
  }
  else {
    iVar7 = -1;
    if ((g->eflags & 1) != 0) {
      iVar7 = g->transparent;
    }
    stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)uVar19 & 7),iVar7);
    g->color_table = g->lpal[0];
    psVar14 = s->img_buffer;
    psVar16 = s->img_buffer_end;
  }
  if (psVar14 < psVar16) {
    s->img_buffer = psVar14 + 1;
    bVar5 = *psVar14;
  }
  else {
    if (s->read_from_callbacks == 0) {
      bVar5 = 0;
      goto LAB_0031c333;
    }
    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar7 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
      psVar14 = psVar13;
    }
    else {
      bVar5 = *psVar15;
      psVar14 = psVar15 + iVar7;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar13;
  }
  if (0xc < bVar5) {
    return (stbi_uc *)0x0;
  }
LAB_0031c333:
  uVar19 = 1 << (bVar5 & 0x1f);
  uVar20 = 0;
  do {
    g->codes[uVar20].prefix = -1;
    g->codes[uVar20].first = (stbi_uc)uVar20;
    g->codes[uVar20].suffix = (stbi_uc)uVar20;
    uVar20 = uVar20 + 1;
  } while (uVar19 != uVar20);
  uVar11 = (2 << (bVar5 & 0x1f)) - 1;
  n = 0;
  iVar7 = 0;
  uVar6 = 0;
  bVar21 = 0;
  uVar25 = uVar19 + 2;
  uVar3 = 0xffffffff;
  iVar8 = bVar5 + 1;
  uVar4 = uVar11;
  do {
    while (uVar12 = uVar4, iVar9 = iVar8, uVar23 = uVar3, uVar24 = uVar25, bVar26 = bVar21,
          iVar8 = iVar7 - iVar9, iVar9 <= iVar7) {
      uVar25 = (int)uVar6 >> ((byte)iVar9 & 0x1f);
      uVar27 = uVar6 & uVar12;
      iVar7 = iVar8;
      uVar6 = uVar25;
      bVar21 = 1;
      uVar25 = uVar19 + 2;
      uVar3 = 0xffffffff;
      iVar8 = bVar5 + 1;
      uVar4 = uVar11;
      if (uVar27 != uVar19) {
        if (uVar27 == uVar19 + 1) goto LAB_0031c5fe;
        if ((int)uVar24 < (int)uVar27) {
          stbi__g_failure_reason = "illegal code in raster";
          return (stbi_uc *)0x0;
        }
        if ((bool)(bVar26 ^ 1)) {
          stbi__g_failure_reason = "no clear code";
          return (stbi_uc *)0x0;
        }
        if ((int)uVar23 < 0) {
          if (uVar27 == uVar24) {
            stbi__g_failure_reason = "illegal code in raster";
            return (stbi_uc *)0x0;
          }
        }
        else {
          if (0x1fff < (int)uVar24) {
            stbi__g_failure_reason = "too many codes";
            return (stbi_uc *)0x0;
          }
          g->codes[(int)uVar24].prefix = (stbi__int16)uVar23;
          sVar18 = g->codes[uVar23].first;
          g->codes[(int)uVar24].first = sVar18;
          if (uVar27 != uVar24 + 1) {
            sVar18 = g->codes[(int)uVar27].first;
          }
          g->codes[(int)uVar24].suffix = sVar18;
          uVar24 = uVar24 + 1;
        }
        stbi__out_gif_code(g,(stbi__uint16)uVar27);
        bVar21 = 1;
        uVar25 = uVar24;
        uVar3 = uVar27;
        iVar8 = iVar9 + 1;
        uVar4 = ~(-1 << ((byte)(iVar9 + 1) & 0x1f));
        if ((uVar24 & uVar12) != 0 || 0xfff < (int)uVar24) {
          iVar8 = iVar9;
          uVar4 = uVar12;
        }
      }
    }
    psVar14 = s->img_buffer;
    psVar16 = s->img_buffer_end;
    if (n == 0) {
      if (psVar14 < psVar16) {
        s->img_buffer = psVar14 + 1;
        bVar21 = *psVar14;
        psVar14 = psVar14 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0031c66e;
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar21 = 0;
          psVar16 = psVar13;
        }
        else {
          bVar21 = *psVar15;
          psVar16 = psVar15 + iVar8;
        }
        s->img_buffer_end = psVar16;
        s->img_buffer = psVar13;
        psVar14 = psVar13;
      }
      if (bVar21 == 0) goto LAB_0031c66e;
      n = (uint)bVar21;
    }
    if (psVar14 < psVar16) {
      s->img_buffer = psVar14 + 1;
      bVar21 = *psVar14;
    }
    else if (s->read_from_callbacks == 0) {
      bVar21 = 0;
    }
    else {
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar21 = 0;
        psVar14 = psVar13;
      }
      else {
        bVar21 = *psVar15;
        psVar14 = psVar15 + iVar8;
      }
      s->img_buffer_end = psVar14;
      s->img_buffer = psVar13;
    }
    bVar17 = (byte)iVar7;
    n = n - 1;
    iVar7 = iVar7 + 8;
    uVar6 = uVar6 | (uint)bVar21 << (bVar17 & 0x1f);
    bVar21 = bVar26;
    uVar25 = uVar24;
    uVar3 = uVar23;
    iVar8 = iVar9;
    uVar4 = uVar12;
  } while( true );
LAB_0031c5fe:
  stbi__skip(s,n);
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
    s->img_buffer = pbVar2 + 1;
    bVar5 = *pbVar2;
  }
  else {
    if (s->read_from_callbacks == 0) {
LAB_0031c66e:
      psVar15 = g->out;
      if (psVar15 == (stbi_uc *)0x0) {
        return (stbi_uc *)0x0;
      }
      if (psVar1 != (stbi_uc *)0x0) {
        return psVar15;
      }
      uVar19 = g->h * g->w;
      if ((int)uVar19 < 1 || g->bgindex < 1) {
        return psVar15;
      }
      uVar20 = 0;
      do {
        if (g->history[uVar20] == '\0') {
          g->pal[g->bgindex][3] = 0xff;
          *(stbi_uc (*) [4])(g->out + uVar20 * 4) = g->pal[g->bgindex];
        }
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
      return psVar15;
    }
    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
    if (iVar7 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
      psVar14 = psVar13;
    }
    else {
      bVar5 = *psVar15;
      psVar14 = psVar15 + iVar7;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar13;
  }
  if (bVar5 == 0) goto LAB_0031c66e;
  n = (uint)bVar5;
  goto LAB_0031c5fe;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}